

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O1

bool __thiscall QCborStreamReader::leaveContainer(QCborStreamReader *this)

{
  long lVar1;
  CborError CVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  value_type v;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(long *)(lVar1 + 0x30) == 0) {
    leaveContainer();
  }
  else if (*(char *)(lVar1 + 0x70) == '\0') {
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    iVar3 = QList<CborValue>::end((QList<CborValue> *)(lVar1 + 0x20));
    local_38._0_8_ = iVar3.i[-1].parser;
    local_38._16_4_ = iVar3.i[-1].remaining;
    local_38._20_2_ = iVar3.i[-1].extra;
    local_38[0x16] = iVar3.i[-1].type;
    local_38[0x17] = iVar3.i[-1].flags;
    *(long *)(lVar1 + 0x30) = *(long *)(lVar1 + 0x30) + -1;
    local_38._8_8_ = ((anon_union_8_2_3241046c_for_source *)(*(long *)(this + 8) + 0x50))->ptr;
    if ((*(byte *)(*(long *)(this + 8) + 0x5f) & 0x10) != 0) {
      *(size_type *)(local_38._8_8_ + 0x68) = *(size_type *)(local_38._8_8_ + 0x68) + 1;
      QCborStreamReaderPrivate::preread((QCborStreamReaderPrivate *)local_38._8_8_);
    }
    CVar2 = preparse_next_value((CborValue *)local_38);
    lVar1 = *(long *)(this + 8);
    *(undefined8 *)(lVar1 + 0x48) = local_38._0_8_;
    ((anon_union_8_2_3241046c_for_source *)(lVar1 + 0x50))->ptr = (uint8_t *)local_38._8_8_;
    *(undefined8 *)(lVar1 + 0x58) = local_38._16_8_;
    bVar4 = CVar2 == CborNoError;
    if (bVar4) {
      preparse(this);
    }
    else {
      lVar1 = *(long *)(this + 8);
      if (CVar2 != CborErrorUnexpectedEOF) {
        *(undefined1 *)(lVar1 + 0x70) = 1;
      }
      *(CborError *)(lVar1 + 0x60) = CVar2;
    }
    goto LAB_004ac20a;
  }
  bVar4 = false;
LAB_004ac20a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QCborStreamReader::leaveContainer()
{
    if (d->containerStack.isEmpty()) {
        qWarning("QCborStreamReader::leaveContainer: trying to leave top-level element");
        return false;
    }
    if (d->corrupt)
        return false;

    CborValue container = d->containerStack.pop();
    CborError err = cbor_value_leave_container(&container, &d->currentElement);
    d->currentElement = container;
    if (err) {
        d->handleError(err);
        return false;
    }

    preparse();
    return true;
}